

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O2

void anon_unknown.dwarf_388b1::assert_range_equals(void)

{
  initializer_list<int> __l;
  initializer_list<long> __l_00;
  allocator_type local_69;
  vector<int,_std::allocator<int>_> v;
  list<long,_std::allocator<long>_> li;
  Assert local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_38.m_file = (char *)0x100000000;
  local_38.m_line = 2;
  local_38._12_4_ = 3;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_38;
  std::vector<int,_std::allocator<int>_>::vector(&v,__l,(allocator_type *)&li);
  local_28 = 2;
  uStack_20 = 3;
  local_38.m_file = (char *)0x0;
  local_38.m_line = 1;
  local_38._12_4_ = 0;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_38;
  std::__cxx11::list<long,_std::allocator<long>_>::list(&li,__l_00,&local_69);
  local_38.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_38.m_line = 0x166;
  UnitTests::Assert::
  RangeEquals<std::__cxx11::list<long,std::allocator<long>>&,std::vector<int,std::allocator<int>>&>
            (&local_38,&li,&v);
  std::__cxx11::_List_base<long,_std::allocator<long>_>::_M_clear
            (&li.super__List_base<long,_std::allocator<long>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST(assert_range_equals)
    {
        try
        {
            std::vector<int> v{0, 1, 2, 3};
            std::list<long>  li{0, 1, 2, 3};
            ASSERT_RANGE_EQUALS(li, v);
        }
        catch (UnitTests::TestFailure&)
        {
            FAIL("ASSERT_RANGE_EQUALS should not have fired here.");
        }
    }